

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O1

void createwords(void)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  _Rb_tree<point,_std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *this;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  (*pamVar13) [100];
  int i;
  long lVar14;
  bool bVar15;
  vector<int,_std::allocator<int>_> qu_1;
  vector<int,_std::allocator<int>_> qu;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  select;
  int bucket;
  int local_174;
  long local_170;
  vector<int,_std::allocator<int>_> local_168;
  long local_148;
  ulong local_140;
  int local_134;
  double local_130;
  long local_128;
  ulong local_120;
  undefined1 local_118 [8];
  int *piStack_110;
  _Base_ptr local_108;
  iterator iStack_100;
  _Base_ptr local_f8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_f0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c0;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_88;
  ulong local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  iVar5 = ((ts_len / 0x14 + 9) / 10) * 10;
  local_174 = 10;
  if (10 < iVar5) {
    local_174 = iVar5;
  }
  local_134 = local_174;
  if (local_174 <= ts_len) {
    do {
      pamVar13 = tree;
      lVar14 = 0;
      do {
        if (-1 < num_c) {
          lVar7 = -1;
          this = (_Rb_tree<point,_std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  *)pamVar13;
          do {
            std::
            _Rb_tree<point,_std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::clear(this);
            lVar7 = lVar7 + 1;
            this = this + 1;
          } while (lVar7 < num_c);
        }
        lVar14 = lVar14 + 1;
        pamVar13 = (map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    (*) [100])((long)pamVar13 + 0x12c0);
      } while (lVar14 != 5);
      lVar14 = 0;
      do {
        uVar11 = (long)local_174 / (long)PAA_DIMENSION[lVar14];
        if (local_174 % PAA_DIMENSION[lVar14] == 0) {
          iVar5 = (int)uVar11;
          uVar8 = uVar11 & 0xffffffff;
          local_130 = (double)iVar5;
          local_140 = uVar11 & 0xffffffff;
          if (0 < data_n) {
            local_170 = 0;
            do {
              if (0 < iVar5) {
                iVar9 = 0;
                do {
                  local_118 = (undefined1  [8])0x0;
                  piStack_110 = (int *)0x0;
                  local_108 = (_Base_ptr)0x0;
                  iVar12 = iVar9;
                  iVar4 = iVar9;
                  while (iVar4 = iVar5 + iVar4, iVar4 <= ts_len) {
                    dVar1 = 0.0;
                    if (iVar12 < iVar4) {
                      lVar7 = 0;
                      dVar1 = 0.0;
                      do {
                        dVar1 = dVar1 + data_x.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[local_170].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[iVar12 + lVar7];
                        lVar7 = lVar7 + 1;
                      } while ((int)local_140 != (int)lVar7);
                    }
                    dVar1 = floor((dVar1 / local_130 - min_data) / bucket_w + -1e-08);
                    local_60._M_impl._0_4_ = (BADTYPE)dVar1;
                    if ((_Base_ptr)piStack_110 == local_108) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)local_118,(iterator)piStack_110,
                                 (int *)&local_60);
                    }
                    else {
                      *piStack_110 = local_60._M_impl._0_4_;
                      piStack_110 = piStack_110 + 1;
                    }
                    iVar12 = iVar12 + iVar5;
                  }
                  if ((ulong)(long)PAA_DIMENSION[lVar14] <=
                      (ulong)((long)piStack_110 - (long)local_118 >> 2)) {
                    iVar4 = 0;
                    do {
                      insertintohashmap((vector<int,_std::allocator<int>_> *)local_118,iVar4,
                                        (int)lVar14,(int)local_170,local_174,iVar9);
                      iVar4 = iVar4 + 1;
                    } while ((ulong)(long)(PAA_DIMENSION[lVar14] + iVar4) <=
                             (ulong)((long)piStack_110 - (long)local_118 >> 2));
                  }
                  if (local_118 != (undefined1  [8])0x0) {
                    operator_delete((void *)local_118);
                  }
                  iVar9 = iVar9 + 1;
                } while (iVar9 != iVar5);
              }
              local_170 = local_170 + 1;
            } while (local_170 < data_n);
          }
          if (0 < data_n) {
            local_148 = 0;
            uVar11 = local_140;
            local_120 = uVar8;
            do {
              if (0 < (int)uVar8) {
                uVar3 = 0;
                do {
                  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (int *)0x0;
                  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (int *)0x0;
                  iVar5 = (int)uVar3;
                  local_68 = uVar3;
                  while (iVar5 = iVar5 + (int)uVar8, iVar5 <= ts_len) {
                    dVar1 = 0.0;
                    iVar9 = (int)uVar3;
                    if (iVar9 < iVar5) {
                      lVar7 = 0;
                      dVar1 = 0.0;
                      do {
                        dVar1 = dVar1 + data_x.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[local_148].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[iVar9 + lVar7];
                        lVar7 = lVar7 + 1;
                      } while ((int)uVar11 != (int)lVar7);
                    }
                    dVar1 = floor((dVar1 / local_130 - min_data) / bucket_w);
                    local_118._0_4_ = (int)dVar1;
                    if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_168,
                                 (iterator)
                                 local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(int *)local_118);
                    }
                    else {
                      *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = (int)dVar1;
                      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    uVar3 = (ulong)(uint)(iVar9 + (int)uVar8);
                  }
                  if ((ulong)(long)PAA_DIMENSION[lVar14] <=
                      (ulong)((long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2)) {
                    local_128 = 0;
                    iVar5 = 0;
                    do {
                      local_88.
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_88.
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      iVar9 = 0;
                      bVar15 = false;
                      local_88.
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
                           &local_60._M_impl.super__Rb_tree_header._M_header;
                      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
                      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
                           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
                      if (0 < num_c) {
                        lVar7 = 0x28;
                        lVar10 = 0;
                        do {
                          queryfromhashmap((set<int,_std::less<int>,_std::allocator<int>_> *)
                                           local_118,&local_168,iVar5,(int)lVar14,(int)lVar10);
                          std::
                          vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                          ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
                                    ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                                      *)&local_88,
                                     (set<int,_std::less<int>,_std::allocator<int>_> *)local_118);
                          std::
                          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          ::~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                       *)local_118);
                          if (*(long *)(&((local_88.
                                           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl
                                         .field_0x0 + lVar7) != 0) {
                            std::
                            _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                        *)&local_60,
                                       *(_Base_ptr *)
                                        ((long)local_88.
                                               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                        lVar7 + -0x10),
                                       (_Base_ptr)
                                       ((long)local_88.
                                              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                       lVar7 + -0x20));
                            iVar9 = iVar9 + 1;
                          }
                          lVar10 = lVar10 + 1;
                          lVar7 = lVar7 + 0x30;
                        } while (lVar10 < num_c);
                        bVar15 = iVar9 == 1;
                        uVar8 = local_120;
                      }
                      if ((bVar15) && (0 < num_c)) {
                        lVar7 = 0;
                        do {
                          iVar9 = (int)local_88.
                                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_t._M_impl
                                       .super__Rb_tree_header._M_node_count;
                          if (iVar9 != 0) {
                            local_118 = (undefined1  [8])((double)iVar9 / (double)datacnt[lVar7]);
                            local_f8 = (_Base_ptr)0x0;
                            local_108 = (_Base_ptr)0x0;
                            iStack_100._M_current = (int *)0x0;
                            local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                            local_f0._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
                                 &local_f0._M_impl.super__Rb_tree_header._M_header;
                            local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
                            local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                            local_c0._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
                                 &local_c0._M_impl.super__Rb_tree_header._M_header;
                            local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
                            piStack_110 = (int *)CONCAT44(piStack_110._4_4_,(int)uVar8);
                            local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
                                 local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
                            local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
                                 local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
                            std::
                            _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            ::operator=(&local_f0,
                                        &local_88.
                                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_t);
                            std::
                            _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            ::operator=(&local_c0,&local_60);
                            if (0 < PAA_DIMENSION[lVar14]) {
                              lVar6 = 0;
                              lVar10 = local_128;
                              do {
                                if ((_Base_ptr)iStack_100._M_current == local_f8) {
                                  std::vector<int,std::allocator<int>>::
                                  _M_realloc_insert<int_const&>
                                            ((vector<int,std::allocator<int>> *)&local_108,
                                             iStack_100,
                                             (int *)((long)local_168.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar10)
                                            );
                                }
                                else {
                                  *iStack_100._M_current =
                                       *(int *)((long)local_168.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start +
                                               lVar10);
                                  iStack_100._M_current = iStack_100._M_current + 1;
                                }
                                lVar6 = lVar6 + 1;
                                lVar10 = lVar10 + 4;
                              } while (lVar6 < PAA_DIMENSION[lVar14]);
                            }
                            std::vector<paaword,_std::allocator<paaword>_>::push_back
                                      (candidates + lVar7,(value_type *)local_118);
                            uVar8 = local_120;
                            std::
                            _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            ::~_Rb_tree(&local_c0);
                            std::
                            _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            ::~_Rb_tree(&local_f0);
                            if (local_108 != (_Base_ptr)0x0) {
                              operator_delete(local_108);
                            }
                          }
                          lVar7 = lVar7 + 1;
                        } while (lVar7 < num_c);
                      }
                      std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::~_Rb_tree(&local_60);
                      std::
                      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ::~vector(&local_88);
                      iVar5 = iVar5 + 1;
                      local_128 = local_128 + 4;
                    } while ((ulong)((long)iVar5 + (long)PAA_DIMENSION[lVar14]) <=
                             (ulong)((long)local_168.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_168.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 2));
                  }
                  if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  uVar2 = (int)local_68 + 1;
                  uVar3 = (ulong)uVar2;
                  uVar11 = local_140;
                } while (uVar2 != (uint)uVar8);
              }
              local_148 = local_148 + 1;
            } while (local_148 < data_n);
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 5);
      local_174 = local_174 + local_134;
    } while (local_174 <= ts_len);
  }
  return;
}

Assistant:

void createwords() {
    int shapelet_minlen = max(DEFAULT_PAA_DIMENSION, (ts_len / 20 + DEFAULT_PAA_DIMENSION - 1)
                                                     / DEFAULT_PAA_DIMENSION * DEFAULT_PAA_DIMENSION);
    for (int len = shapelet_minlen; len <= ts_len; len += shapelet_minlen) {
//        printf("search length %d:\n", len);

        // clear hash map
        for (int i = 0; i < D_NUM; ++i) {
            for (int j = 0; j <= num_c; ++j) {
                tree[i][j].clear();
            }
        }

        for (int d = 0; d < D_NUM; ++d) {
            if (len % PAA_DIMENSION[d] != 0) {
                continue;
            }

            // PAA window
            int window = len / PAA_DIMENSION[d];

            // insert words into hashmap
            for (int i = 0; i < data_n; ++i) {
                for (int start = 0; start < window; ++start) {
                    vector<int> qu;

                    // PAA
                    for (int offset = start; offset + window <= ts_len; offset += window) {
                        double avg = 0;
                        for (int j = offset; j < offset + window; ++j) {
                            avg += data_x[i][j];
                        }
                        int bucket = (int) floor((avg / window - min_data) / bucket_w - 1e-8);
                        qu.push_back(bucket);
                    }

                    // insert into hash map
                    for (int j = 0; j + PAA_DIMENSION[d] <= qu.size(); ++j) {
//                        insertintohashmap(qu, j, d, i);
                        insertintohashmap(qu, j, d, i, len, start);
                    }

                }
            }
//            printf("dimension %d insert finished\n", PAA_DIMENSION[d]);

            // query from hashmap to calculate tfidf score
            for (int i = 0; i < data_n; ++i) {
                for (int start = 0; start < window; ++start) {
                    vector<int> qu;

                    // PAA
                    for (int offset = start; offset + window <= ts_len; offset += window) {
                        double avg = 0;
                        for (int j = offset; j < offset + window; ++j) {
                            avg += data_x[i][j];
                        }
                        int bucket = (int) floor((avg / window - min_data) / bucket_w);
                        qu.push_back(bucket);
                    }

                    // query from hash map
                    for (int j = 0; j + PAA_DIMENSION[d] <= qu.size(); ++j) {

                        int inclasses = 0;

                        vector<set<int> > select;
                        set<int> allselect;
                        for (int k = 0; k < num_c; ++k) {
                            select.push_back(queryfromhashmap(qu, j, d, k));
                            if (select[k].size() != 0) {
                                ++inclasses;
                                allselect.insert(select[k].begin(), select[k].end());
                            }
                        }

                        if (inclasses != 1) {
                            continue;
                        }
                        double idf = log2(2.0);

//                        double idf = log2((double) (num_c) / inclasses);

                        for (int k = 0; k < num_c; ++k) {

                            int inthisclass = (int) select[k].size();

                            if (inthisclass == 0) {
                                continue;
                            }

                            double tf = (double) (inthisclass) / datacnt[k];

                            paaword now;
                            now.window = window;
                            now.score = tf * idf;
                            now.cov = select[k];
                            now.allcov = allselect;
                            for (int cp = 0; cp < PAA_DIMENSION[d]; ++cp) {
                                now.vec.push_back(qu[j + cp]);
                            }
                            candidates[k].push_back(now);

                        }
                    }
                }
            }
//            printf("dimension %d query finished\n", PAA_DIMENSION[d]);
        }
    }
}